

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum_extraction.cc
# Opt level: O2

void __thiscall
sptk::SpectrumExtraction::SpectrumExtraction
          (SpectrumExtraction *this,int fft_length,int frame_shift,double sampling_rate,
          bool f0_refinement,Algorithms algorithm)

{
  SpectrumExtractionByWorld *this_00;
  
  this->_vptr_SpectrumExtraction = (_func_int **)&PTR__SpectrumExtraction_0011d870;
  if (algorithm == kWorld) {
    this_00 = (SpectrumExtractionByWorld *)operator_new(0x20);
    SpectrumExtractionByWorld::SpectrumExtractionByWorld
              (this_00,fft_length,frame_shift,sampling_rate,f0_refinement);
  }
  else {
    this_00 = (SpectrumExtractionByWorld *)0x0;
  }
  this->spectrum_extraction_ = &this_00->super_SpectrumExtractionInterface;
  return;
}

Assistant:

SpectrumExtraction::SpectrumExtraction(
    int fft_length, int frame_shift, double sampling_rate, bool f0_refinement,
    SpectrumExtraction::Algorithms algorithm) {
  switch (algorithm) {
    case kWorld: {
      spectrum_extraction_ = new SpectrumExtractionByWorld(
          fft_length, frame_shift, sampling_rate, f0_refinement);
      break;
    }
    default: {
      spectrum_extraction_ = NULL;
      break;
    }
  }
}